

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poller.cpp
# Opt level: O3

bool __thiscall sznet::net::Poller::hasChannel(Poller *this,Channel *channel)

{
  int iVar1;
  EventLoop *this_00;
  bool bVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  
  this_00 = this->m_ownerLoop;
  bVar2 = EventLoop::isInLoopThread(this_00);
  if (!bVar2) {
    EventLoop::abortNotInLoopThread(this_00);
  }
  p_Var3 = (this->m_channels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var3 != (_Base_ptr)0x0) {
    iVar1 = channel->m_fd;
    p_Var5 = &(this->m_channels)._M_t._M_impl.super__Rb_tree_header;
    p_Var4 = &p_Var5->_M_header;
    do {
      if (iVar1 <= (int)p_Var3[1]._M_color) {
        p_Var4 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < iVar1];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var4 != p_Var5) && ((int)p_Var4[1]._M_color <= iVar1)) {
      return (Channel *)p_Var4[1]._M_parent == channel;
    }
  }
  return false;
}

Assistant:

bool Poller::hasChannel(Channel* channel) const
{
	assertInLoopThread();
	ChannelMap::const_iterator it = m_channels.find(channel->fd());
	return it != m_channels.end() && it->second == channel;
}